

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O0

void packBE(uint8_t *p,uint32_t value,uint8_t u8Size)

{
  uint local_1c;
  uint8_t local_15;
  uint32_t tmp;
  uint8_t u8Size_local;
  uint8_t *puStack_10;
  uint32_t value_local;
  uint8_t *p_local;
  
  if ((u8Size != '\0') && (u8Size < 5)) {
    local_1c = value;
    puStack_10 = p + (int)(u8Size - 1);
    for (local_15 = u8Size; local_15 != '\0'; local_15 = local_15 + 0xff) {
      *puStack_10 = (uint8_t)local_1c;
      local_1c = local_1c >> 8;
      puStack_10 = puStack_10 + -1;
    }
  }
  return;
}

Assistant:

void packBE(_PACK_UINT8* p, _PACK_UINT32 value, _PACK_UINT8 u8Size)
{
   if ((u8Size > 0) && (u8Size <= sizeof(_PACK_UINT32)))
   {
#if defined(PLATFORM_BYTE_ORDER) && (PLATFORM_BYTE_ORDER==PLATFORM_BIG_ENDIAN)
      memcpy(p, &value, u8Size);
#else
      register _PACK_UINT32 tmp = value;
      p += (u8Size - 1);
      while (u8Size > 0)
      {
         *(p--) = (_PACK_UINT8)tmp;
         tmp = tmp >> 8;
         u8Size--;
      }
#endif
   }
}